

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.cpp
# Opt level: O0

Entry * __thiscall
cali::Blackboard::exchange
          (Entry *__return_storage_ptr__,Blackboard *this,cali_id_t key,Entry *value,
          bool include_in_snapshots)

{
  size_t sVar1;
  size_t I;
  bool include_in_snapshots_local;
  Entry *value_local;
  cali_id_t key_local;
  Blackboard *this_local;
  
  sVar1 = find_existing_entry(this,key);
  Entry::Entry(__return_storage_ptr__);
  if (this->hashtable[sVar1].key == key) {
    __return_storage_ptr__->m_node = this->hashtable[sVar1].value.m_node;
    (__return_storage_ptr__->m_value).m_v.type_and_size =
         this->hashtable[sVar1].value.m_value.m_v.type_and_size;
    (__return_storage_ptr__->m_value).m_v.value = this->hashtable[sVar1].value.m_value.m_v.value;
    this->hashtable[sVar1].value.m_node = value->m_node;
    this->hashtable[sVar1].value.m_value.m_v.type_and_size = (value->m_value).m_v.type_and_size;
    this->hashtable[sVar1].value.m_value.m_v.value = (value->m_value).m_v.value;
  }
  else {
    add(this,key,value,include_in_snapshots);
  }
  std::__atomic_base<int>::operator++(&(this->ucount).super___atomic_base<int>);
  return __return_storage_ptr__;
}

Assistant:

Entry Blackboard::exchange(cali_id_t key, const Entry& value, bool include_in_snapshots)
{
    size_t I = find_existing_entry(key);
    Entry  ret;

    if (hashtable[I].key == key) {
        ret                = hashtable[I].value;
        hashtable[I].value = value;
    } else
        add(key, value, include_in_snapshots);

    ++ucount;

    return ret;
}